

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void become_aware(chunk *c,monster *mon)

{
  _Bool _Var1;
  monster_lore_conflict *pmVar2;
  object *poVar3;
  loc_conflict lVar4;
  chunk *local_a0;
  chunk *p_c;
  object *local_80;
  object *given;
  char o_name [80];
  object *obj;
  monster_lore *lore;
  monster *mon_local;
  chunk *c_local;
  
  pmVar2 = get_lore(mon->race);
  _Var1 = flag_has_dbg(mon->mflag,2,7,"mon->mflag","MFLAG_CAMOUFLAGE");
  if (_Var1) {
    flag_off(mon->mflag,2,7);
    _Var1 = flag_has_dbg(mon->race->flags,0xc,0x16,"mon->race->flags","RF_UNAWARE");
    if (_Var1) {
      flag_on_dbg(pmVar2->flags,0xc,0x16,"lore->flags","RF_UNAWARE");
    }
    if (mon->mimicked_obj != (object *)0x0) {
      o_name._72_8_ = mon->mimicked_obj;
      object_desc((char *)&given,0x50,(object *)o_name._72_8_,0,player);
      _Var1 = square_isseen(c,*(loc_conflict *)(o_name._72_8_ + 0x34));
      if (_Var1) {
        msg("The %s was really a monster!",&given);
      }
      *(undefined2 *)(o_name._72_8_ + 0x12e) = 0;
      mon->mimicked_obj = (object *)0x0;
      _Var1 = flag_has_dbg(mon->race->flags,0xc,0x1e,"mon->race->flags","RF_MIMIC_INV");
      if (_Var1) {
        local_80 = object_new();
        object_copy(local_80,(object *)o_name._72_8_);
        local_80->oidx = 0;
        if (*(long *)(o_name._72_8_ + 0x28) != 0) {
          poVar3 = object_new();
          local_80->known = poVar3;
          object_copy(local_80->known,*(object **)(o_name._72_8_ + 0x28));
          local_80->known->oidx = 0;
          poVar3 = local_80->known;
          lVar4 = (loc_conflict)loc(0,0);
          poVar3->grid = lVar4;
        }
        _Var1 = monster_carry(c,mon,local_80);
        if (!_Var1) {
          if (c == (chunk *)cave) {
            local_a0 = (chunk *)player->cave;
          }
          else {
            local_a0 = (chunk *)0x0;
          }
          if (local_80->known != (object *)0x0) {
            object_delete(local_a0,(chunk *)0x0,&local_80->known);
          }
          object_delete(c,local_a0,&local_80);
        }
      }
      square_delete_object
                (c,*(loc_conflict *)(o_name._72_8_ + 0x34),(object *)o_name._72_8_,false,false);
      update_mon(mon,c,false);
    }
    if (mon->race->light != L'\0') {
      player->upkeep->update = player->upkeep->update | 0xc0;
    }
    player->upkeep->redraw = player->upkeep->redraw | 0xc00000;
  }
  square_note_spot(c,mon->grid);
  square_light_spot(c,mon->grid);
  return;
}

Assistant:

void become_aware(struct chunk *c, struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	if (mflag_has(mon->mflag, MFLAG_CAMOUFLAGE)) {
		mflag_off(mon->mflag, MFLAG_CAMOUFLAGE);

		/* Learn about mimicry */
		if (rf_has(mon->race->flags, RF_UNAWARE))
			rf_on(lore->flags, RF_UNAWARE);

		/* Delete any false items */
		if (mon->mimicked_obj) {
			struct object *obj = mon->mimicked_obj;
			char o_name[80];
			object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

			/* Print a message */
			if (square_isseen(c, obj->grid))
				msg("The %s was really a monster!", o_name);

			/* Clear the mimicry */
			obj->mimicking_m_idx = 0;
			mon->mimicked_obj = NULL;

			/*
			 * Give a copy of the object to the monster if
			 * appropriate.
			 */
			if (rf_has(mon->race->flags, RF_MIMIC_INV)) {
				struct object* given = object_new();

				object_copy(given, obj);
				given->oidx = 0;
				if (obj->known) {
					given->known = object_new();
					object_copy(given->known, obj->known);
					given->known->oidx = 0;
					given->known->grid = loc(0, 0);
				}
				if (!monster_carry(c, mon, given)) {
					struct chunk *p_c = (c == cave) ? player->cave : NULL;
					if (given->known) {
						object_delete(p_c, NULL, &given->known);
					}
					object_delete(c, p_c, &given);
				}
			}

			/*
			 * Delete the mimicked object; noting and lighting
			 * done below outside of the if block.
			 */
			square_delete_object(c, obj->grid, obj, false, false);

			/* Since mimicry affects visibility, update that. */
			update_mon(mon, c, false);
		}

		/* Update monster and item lists */
		if (mon->race->light != 0) {
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
		}
		player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);
	}

	square_note_spot(c, mon->grid);
	square_light_spot(c, mon->grid);
}